

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_compress.c
# Opt level: O0

context * context_new(zip_int32_t method,_Bool compress,int compression_flags,
                     zip_compression_algorithm_t *algorithm)

{
  void *pvVar1;
  zip_int32_t local_44;
  bool local_31;
  context *ctx;
  zip_compression_algorithm_t *algorithm_local;
  int compression_flags_local;
  _Bool compress_local;
  context *pcStack_10;
  zip_int32_t method_local;
  
  pcStack_10 = (context *)malloc(0x2040);
  if (pcStack_10 == (context *)0x0) {
    pcStack_10 = (context *)0x0;
  }
  else {
    zip_error_init((zip_error_t *)pcStack_10);
    if (compress) {
      local_31 = 0xfffffffd < (uint)method;
    }
    else {
      local_31 = false;
    }
    pcStack_10->can_store = local_31;
    pcStack_10->algorithm = algorithm;
    pcStack_10->method = method;
    pcStack_10->compress = compress;
    pcStack_10->end_of_input = false;
    pcStack_10->end_of_stream = false;
    pcStack_10->is_stored = false;
    if ((method == -1) || (local_44 = method, method == -2)) {
      local_44 = 8;
    }
    pvVar1 = (*pcStack_10->algorithm->allocate)
                       ((zip_uint16_t)local_44,compression_flags,(zip_error_t *)pcStack_10);
    pcStack_10->ud = pvVar1;
    if (pvVar1 == (void *)0x0) {
      zip_error_fini((zip_error_t *)pcStack_10);
      free(pcStack_10);
      pcStack_10 = (context *)0x0;
    }
  }
  return pcStack_10;
}

Assistant:

static struct context *
context_new(zip_int32_t method, bool compress, int compression_flags, zip_compression_algorithm_t *algorithm) {
    struct context *ctx;

    if ((ctx = (struct context *)malloc(sizeof(*ctx))) == NULL) {
	return NULL;
    }
    zip_error_init(&ctx->error);
    ctx->can_store = compress ? ZIP_CM_IS_DEFAULT(method) : false;
    ctx->algorithm = algorithm;
    ctx->method = method;
    ctx->compress = compress;
    ctx->end_of_input = false;
    ctx->end_of_stream = false;
    ctx->is_stored = false;

    if ((ctx->ud = ctx->algorithm->allocate(ZIP_CM_ACTUAL(method), compression_flags, &ctx->error)) == NULL) {
	zip_error_fini(&ctx->error);
	free(ctx);
	return NULL;
    }

    return ctx;
}